

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

void __thiscall ThreadPool::start(ThreadPool *this,shared_ptr<ThreadPool::Job> *job,int priority)

{
  deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
  *this_00;
  size_type sVar1;
  reference pvVar2;
  ThreadPoolThread *this_01;
  _Deque_iterator<std::shared_ptr<ThreadPool::Job>,_std::shared_ptr<ThreadPool::Job>_&,_std::shared_ptr<ThreadPool::Job>_*>
  local_68;
  _Deque_iterator<std::shared_ptr<ThreadPool::Job>,_std::shared_ptr<ThreadPool::Job>_&,_std::shared_ptr<ThreadPool::Job>_*>
  local_48;
  
  ((job->super___shared_ptr<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->mPriority =
       priority;
  if (priority == -1) {
    this_01 = (ThreadPoolThread *)operator_new(0x78);
    ThreadPoolThread::ThreadPoolThread(this_01,job);
    Thread::start((Thread *)this_01,this->mPriority,this->mThreadStackSize);
    return;
  }
  std::mutex::lock(&this->mMutex);
  this_00 = &this->mJobs;
  if ((this->mJobs).
      super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->mJobs).
      super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    sVar1 = std::
            deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
            ::size(this_00);
    pvVar2 = std::
             deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
             ::at(this_00,sVar1 - 1);
    if (((pvVar2->super___shared_ptr<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        mPriority < priority) {
      pvVar2 = std::
               deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
               ::at(this_00,0);
      if (((pvVar2->super___shared_ptr<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          mPriority < priority) {
        std::
        deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
        ::push_front(this_00,job);
      }
      else {
        std::
        deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
        ::push_back(this_00,job);
        local_48._M_cur =
             (this->mJobs).
             super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_48._M_first =
             (this->mJobs).
             super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first;
        local_48._M_last =
             (this->mJobs).
             super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
        local_48._M_node =
             (this->mJobs).
             super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
        local_68._M_cur =
             (this->mJobs).
             super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_68._M_first =
             (this->mJobs).
             super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
        local_68._M_last =
             (this->mJobs).
             super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last;
        local_68._M_node =
             (this->mJobs).
             super__Deque_base<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
        std::
        sort<std::_Deque_iterator<std::shared_ptr<ThreadPool::Job>,std::shared_ptr<ThreadPool::Job>&,std::shared_ptr<ThreadPool::Job>*>,bool(*)(std::shared_ptr<ThreadPool::Job>const&,std::shared_ptr<ThreadPool::Job>const&)>
                  (&local_48,&local_68,jobLessThan);
      }
      goto LAB_001869d4;
    }
  }
  std::deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>::
  push_back(this_00,job);
LAB_001869d4:
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  return;
}

Assistant:

void ThreadPool::start(const std::shared_ptr<Job> &job, int priority)
{
    job->mPriority = priority;
    if (priority == Guaranteed) {
        ThreadPoolThread *t = new ThreadPoolThread(job);
        t->start(mPriority, mThreadStackSize);
        return;
    }

    std::lock_guard<std::mutex> lock(mMutex);
    if (mJobs.empty()) {
        mJobs.push_back(job);
    } else {
        if (mJobs.at(mJobs.size() - 1)->mPriority >= priority) {
            mJobs.push_back(job);
        } else if (mJobs.at(0)->mPriority < priority) {
            mJobs.push_front(job);
        } else {
            mJobs.push_back(job);
            std::sort(mJobs.begin(), mJobs.end(), jobLessThan);
        }
    }
    mCond.notify_one();
}